

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UBXProtocol.h
# Opt level: O0

int AnalyzePacketUBX(uchar *buf,int buflen,int *pmclass,int *pmid,int *ppacketlen,
                    int *pnbBytesToRequest,int *pnbBytesToDiscard)

{
  int iVar1;
  int *pnbBytesToRequest_local;
  int *ppacketlen_local;
  int *pmid_local;
  int *pmclass_local;
  int buflen_local;
  uchar *buf_local;
  
  *ppacketlen = 0;
  *pnbBytesToRequest = -1;
  *pnbBytesToDiscard = 0;
  if (buflen < 8) {
    *pnbBytesToRequest = 8 - buflen;
    buf_local._4_4_ = 6;
  }
  else if ((*buf == 0xb5) && (buf[1] == 'b')) {
    *pmclass = (uint)buf[2];
    *pmid = (uint)buf[3];
    iVar1 = GetPacketLengthUBX(buf);
    *ppacketlen = iVar1;
    if (buflen < *ppacketlen) {
      *pnbBytesToRequest = *ppacketlen - buflen;
      buf_local._4_4_ = 6;
    }
    else {
      iVar1 = CheckChecksumUBX(buf,*ppacketlen);
      if (iVar1 == 0) {
        buf_local._4_4_ = 0;
      }
      else {
        printf("Warning : UBX checksum error. \n");
        *pnbBytesToDiscard = 2;
        buf_local._4_4_ = 1;
      }
    }
  }
  else {
    *pnbBytesToDiscard = 1;
    buf_local._4_4_ = 1;
  }
  return buf_local._4_4_;
}

Assistant:

inline int AnalyzePacketUBX(unsigned char* buf, int buflen, int* pmclass, int* pmid, int* ppacketlen, 
							int* pnbBytesToRequest, int* pnbBytesToDiscard)
{
	*ppacketlen = 0;
	*pnbBytesToRequest = -1;
	*pnbBytesToDiscard = 0;
	if (buflen < MIN_PACKET_LENGTH_UBX)
	{
		*pnbBytesToRequest = MIN_PACKET_LENGTH_UBX-buflen;
		return EXIT_OUT_OF_MEMORY;
	}
	if ((buf[0] != SYNC_CHAR_1_UBX)||(buf[1] != SYNC_CHAR_2_UBX))
	{
		*pnbBytesToDiscard = 1; // We are only sure that the first sync byte can be discarded...
		return EXIT_FAILURE;
	}
	*pmclass = buf[2];
	*pmid = buf[3];
	*ppacketlen = GetPacketLengthUBX(buf);	
	if (buflen < *ppacketlen)
	{
		*pnbBytesToRequest = *ppacketlen-buflen;
		return EXIT_OUT_OF_MEMORY;
	}
	if (CheckChecksumUBX(buf, *ppacketlen) != EXIT_SUCCESS)
	{ 
		printf("Warning : UBX checksum error. \n");
		*pnbBytesToDiscard = 2; // We are only sure that the 2 sync bytes can be discarded...
		return EXIT_FAILURE;	
	}

	return EXIT_SUCCESS;
}